

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall
NetOptimize::replace_convolution_with_innerproduct_after_global_pooling(NetOptimize *this)

{
  int iVar1;
  undefined4 uVar2;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar3;
  Layer *pLVar4;
  int *piVar5;
  bool bVar6;
  Layer *pLVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong local_50;
  ParamDict pd;
  
  pvVar3 = (this->super_ModelWriter).layers;
  uVar8 = (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  local_50 = 1;
  uVar10 = 0;
  do {
    if (uVar10 == uVar8) {
      return 0;
    }
    bVar6 = std::operator!=(&(((this->super_ModelWriter).layers)->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar10]->type,"Pooling");
    if ((!bVar6) &&
       (pLVar7 = (((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar10],
       *(int *)((long)&pLVar7[1].userdata + 4) != 0)) {
      iVar1 = *(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar9 = local_50; uVar9 < uVar8; uVar9 = uVar9 + 1) {
        bVar6 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar9]->type,"Convolution"
                               );
        if (((!bVar6) &&
            (pLVar4 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar9],
            piVar5 = (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar5 == 4)) && (*piVar5 == iVar1)) {
          if (uVar8 != uVar9) {
            pLVar4 = (((this->super_ModelWriter).layers)->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar9];
            fprintf(_stderr,"replace_convolution_with_innerproduct_after_global_pooling %s %s\n",
                    (pLVar7->name)._M_dataplus._M_p,(pLVar4->name)._M_dataplus._M_p);
            pLVar7 = ncnn::create_layer("InnerProduct");
            std::__cxx11::string::assign((char *)&pLVar7->type);
            std::__cxx11::string::_M_assign((string *)&pLVar7->name);
            std::vector<int,_std::allocator<int>_>::operator=(&pLVar7->bottoms,&pLVar4->bottoms);
            std::vector<int,_std::allocator<int>_>::operator=(&pLVar7->tops,&pLVar4->tops);
            ncnn::ParamDict::ParamDict(&pd);
            (*pLVar7->_vptr_Layer[2])(pLVar7,&pd);
            *(undefined4 *)&pLVar7[1]._vptr_Layer = *(undefined4 *)&pLVar4[1]._vptr_Layer;
            *(pointer *)((long)&pLVar7[1]._vptr_Layer + 4) = pLVar4[1].type._M_dataplus._M_p;
            uVar2 = (undefined4)pLVar4[1].type._M_string_length;
            pLVar7[1].support_bf16_storage = (bool)(char)uVar2;
            pLVar7[1].support_fp16_storage = (bool)(char)((uint)uVar2 >> 8);
            pLVar7[1].support_int8_storage = (bool)(char)((uint)uVar2 >> 0x10);
            pLVar7[1].support_image_storage = (bool)(char)((uint)uVar2 >> 0x18);
            ncnn::Mat::operator=
                      ((Mat *)&pLVar7[1].name.field_2,
                       (Mat *)&pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
            ncnn::Mat::operator=
                      ((Mat *)&pLVar7[1].bottom_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish,(Mat *)&pLVar4[2].one_blob_only);
            ncnn::Mat::operator=((Mat *)&pLVar7[2].userdata,(Mat *)&pLVar4[2].name);
            ncnn::Mat::operator=
                      ((Mat *)((long)&pLVar7[2].name.field_2 + 8),
                       (Mat *)&pLVar4[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
            uVar2 = *(undefined4 *)((long)&pLVar4[1].type._M_string_length + 4);
            pLVar7[1].support_tensor_storage = (bool)(char)uVar2;
            pLVar7[1].support_weight_fp16_storage = (bool)(char)((uint)uVar2 >> 8);
            pLVar7[1].support_reserved_0 = (bool)(char)((uint)uVar2 >> 0x10);
            pLVar7[1].support_reserved_1 = (bool)(char)((uint)uVar2 >> 0x18);
            ncnn::Mat::operator=
                      ((Mat *)&pLVar7[1].support_reserved_6,(Mat *)&pLVar4[1].type.field_2);
            (((this->super_ModelWriter).layers)->
            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar9] = pLVar7;
            (*pLVar4->_vptr_Layer[1])(pLVar4);
            ncnn::ParamDict::~ParamDict(&pd);
          }
          break;
        }
      }
    }
    uVar10 = uVar10 + 1;
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

int NetOptimize::replace_convolution_with_innerproduct_after_global_pooling()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Pooling")
            continue;

        ncnn::Pooling* pooling = (ncnn::Pooling*)layers[i];
        if (pooling->global_pooling == 0)
            continue;

        // Pooling - Convolution
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Convolution")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Convolution* convolution = (ncnn::Convolution*)layers[j];

        fprintf(stderr, "replace_convolution_with_innerproduct_after_global_pooling %s %s\n", pooling->name.c_str(), convolution->name.c_str());

        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)ncnn::create_layer("InnerProduct");

        innerproduct->type = "InnerProduct";
        innerproduct->name = convolution->name;
        innerproduct->bottoms = convolution->bottoms;
        innerproduct->tops = convolution->tops;

        ncnn::ParamDict pd;
        innerproduct->load_param(pd);

        innerproduct->num_output = convolution->num_output;
        innerproduct->bias_term = convolution->bias_term;
        innerproduct->weight_data_size = convolution->weight_data_size;
        innerproduct->int8_scale_term = convolution->int8_scale_term;

        innerproduct->weight_data = convolution->weight_data;
        innerproduct->bias_data = convolution->bias_data;
#if NCNN_INT8
        innerproduct->weight_data_int8_scales = convolution->weight_data_int8_scales;
        innerproduct->bottom_blob_int8_scales = convolution->bottom_blob_int8_scales;
#endif

        innerproduct->activation_type = convolution->activation_type;
        innerproduct->activation_params = convolution->activation_params;

        layers[j] = innerproduct;
        delete convolution;
    }

    return 0;
}